

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

int32_t u_strlen_63(UChar *s)

{
  UChar UVar1;
  int iVar2;
  
  iVar2 = -1;
  do {
    iVar2 = iVar2 + 1;
    UVar1 = *s;
    s = s + 1;
  } while (UVar1 != L'\0');
  return iVar2;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strlen(const UChar *s) 
{
#if U_SIZEOF_WCHAR_T == U_SIZEOF_UCHAR
    return (int32_t)uprv_wcslen((const wchar_t *)s);
#else
    const UChar *t = s;
    while(*t != 0) {
      ++t;
    }
    return t - s;
#endif
}